

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerlinNoise.cpp
# Opt level: O2

double __thiscall PerlinNoise::grad(PerlinNoise *this,int hash,double x,double y,double z)

{
  double dVar1;
  
  dVar1 = y;
  if ((3 < (hash & 0xfU)) && (dVar1 = x, (hash & 0xdU) != 0xc)) {
    dVar1 = z;
  }
  if (7 < (hash & 0xfU)) {
    x = y;
  }
  if ((hash & 1U) != 0) {
    x = -x;
  }
  if ((hash & 2U) != 0) {
    dVar1 = -dVar1;
  }
  return x + dVar1;
}

Assistant:

double PerlinNoise::grad(int hash, double x, double y, double z) {
    int h = hash & 15;
    // Convert lower 4 bits of hash into 12 gradient directions
    double u = h < 8 ? x : y,
           v = h < 4 ? y : h == 12 || h == 14 ? x : z;
    return ((h & 1) == 0 ? u : -u) + ((h & 2) == 0 ? v : -v);
}